

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialJointPolicyPureVector.h
# Opt level: O0

void __thiscall
PartialJointPolicyPureVector::PartialJointPolicyPureVector
          (PartialJointPolicyPureVector *this,PartialJointPolicyPureVector *a)

{
  PartialJointPolicyDiscretePure *in_RSI;
  JPolComponent_VectorImplementation *in_RDI;
  JPolComponent_VectorImplementation *unaff_retaddr;
  PartialJointPolicyDiscretePure *in_stack_ffffffffffffffe8;
  JPolComponent_VectorImplementation *o;
  
  o = in_RDI;
  PartialJointPolicyDiscretePure::PartialJointPolicyDiscretePure(in_RSI,in_stack_ffffffffffffffe8);
  JPolComponent_VectorImplementation::JPolComponent_VectorImplementation(unaff_retaddr,o);
  in_RDI->_vptr_JPolComponent_VectorImplementation = (_func_int **)&PTR_operator__00d14630;
  (in_RDI->_m_indivPols_PolicyPureVector).
  super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00d14710;
  return;
}

Assistant:

PartialJointPolicyPureVector(const PartialJointPolicyPureVector& a)
            :
            PartialJointPolicyDiscretePure(a)
            , JPolComponent_VectorImplementation(a)
        {}